

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void auto_arima_setSeasonalParameters(auto_arima_object obj,char *test,double alpha)

{
  int iVar1;
  
  iVar1 = strcmp(test,"ocsb");
  if (iVar1 != 0) {
    iVar1 = strcmp(test,"seas");
    if (iVar1 != 0) {
      puts("Only two tests are allowed - seas and ocsb ");
      exit(-1);
    }
  }
  strcpy(obj->seas,test);
  obj->alpha_seas = alpha;
  return;
}

Assistant:

void auto_arima_setSeasonalParameters(auto_arima_object obj,const char *test, double alpha) {
	if (!strcmp(test,"ocsb") || !strcmp(test,"seas")) {
		strcpy(obj->seas,test);
	} else {
		printf("Only two tests are allowed - seas and ocsb \n");
		exit(-1);
	}

	obj->alpha_seas = alpha;
}